

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderLineStrip<ImPlot::GetterYs<int>,ImPlot::TransformerLogLin>
               (GetterYs<int> *getter,TransformerLogLin *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  ImVec2 IVar2;
  int iVar3;
  ImPlotPlot *pIVar4;
  double dVar5;
  double dVar6;
  ImPlotContext *pIVar7;
  ImPlotContext *pIVar8;
  int iVar9;
  int iVar10;
  ImPlotContext *gp;
  float fVar11;
  float fVar12;
  float fVar13;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_60;
  undefined1 local_58 [8];
  TransformerLogLin *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar7 = GImPlot;
  pIVar4 = GImPlot->CurrentPlot;
  if (((pIVar4->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar9 = getter->Count;
    local_48 = iVar9 + -1;
    iVar9 = *(int *)((long)getter->Ys +
                    (long)((getter->Offset % iVar9 + iVar9) % iVar9) * (long)getter->Stride);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    local_40 = line_weight;
    dVar5 = log10((getter->XScale * 0.0 + getter->X0) / (pIVar4->XAxis).Range.Min);
    pIVar4 = pIVar7->CurrentPlot;
    dVar6 = (pIVar4->XAxis).Range.Min;
    iVar10 = transformer->YAxis;
    IVar2 = pIVar7->PixelRange[iVar10].Min;
    local_3c.y = (float)(pIVar7->My[iVar10] * ((double)iVar9 - pIVar4->YAxis[iVar10].Range.Min) +
                        (double)IVar2.y);
    local_3c.x = (float)(pIVar7->Mx *
                         (((double)(float)(dVar5 / pIVar7->LogDenX) *
                           ((pIVar4->XAxis).Range.Max - dVar6) + dVar6) - dVar6) + (double)IVar2.x);
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterYs<int>,ImPlot::TransformerLogLin>>
              ((LineStripRenderer<ImPlot::GetterYs<int>,_ImPlot::TransformerLogLin> *)local_58,
               DrawList,&pIVar4->PlotRect);
  }
  else {
    iVar9 = getter->Count;
    iVar9 = *(int *)((long)getter->Ys +
                    (long)((getter->Offset % iVar9 + iVar9) % iVar9) * (long)getter->Stride);
    dVar5 = log10((getter->XScale * 0.0 + getter->X0) / (pIVar4->XAxis).Range.Min);
    pIVar4 = pIVar7->CurrentPlot;
    dVar6 = (pIVar4->XAxis).Range.Min;
    iVar10 = transformer->YAxis;
    IVar2 = pIVar7->PixelRange[iVar10].Min;
    local_58._4_4_ =
         (float)(pIVar7->My[iVar10] * ((double)iVar9 - pIVar4->YAxis[iVar10].Range.Min) +
                (double)IVar2.y);
    local_58._0_4_ =
         (float)(pIVar7->Mx *
                 (((double)(float)(dVar5 / pIVar7->LogDenX) * ((pIVar4->XAxis).Range.Max - dVar6) +
                  dVar6) - dVar6) + (double)IVar2.x);
    iVar9 = getter->Count;
    if (1 < iVar9) {
      iVar10 = 1;
      do {
        pIVar8 = GImPlot;
        iVar9 = *(int *)((long)getter->Ys +
                        (long)(((getter->Offset + iVar10) % iVar9 + iVar9) % iVar9) *
                        (long)getter->Stride);
        dVar5 = log10(((double)iVar10 * getter->XScale + getter->X0) /
                      (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar4 = pIVar8->CurrentPlot;
        dVar6 = (pIVar4->XAxis).Range.Min;
        iVar3 = transformer->YAxis;
        IVar2 = pIVar8->PixelRange[iVar3].Min;
        fVar11 = (float)(pIVar8->Mx *
                         (((double)(float)(dVar5 / pIVar8->LogDenX) *
                           ((pIVar4->XAxis).Range.Max - dVar6) + dVar6) - dVar6) + (double)IVar2.x);
        fVar12 = (float)(pIVar8->My[iVar3] * ((double)iVar9 - pIVar4->YAxis[iVar3].Range.Min) +
                        (double)IVar2.y);
        local_60.y = fVar12;
        local_60.x = fVar11;
        pIVar4 = pIVar7->CurrentPlot;
        fVar13 = (float)local_58._4_4_;
        if (fVar12 <= (float)local_58._4_4_) {
          fVar13 = fVar12;
        }
        if ((fVar13 < (pIVar4->PlotRect).Max.y) &&
           (fVar13 = (float)(~-(uint)(fVar12 <= (float)local_58._4_4_) & (uint)fVar12 |
                            local_58._4_4_ & -(uint)(fVar12 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar4->PlotRect).Min.y, *pfVar1 <= fVar13 && fVar13 != *pfVar1)) {
          fVar13 = (float)local_58._0_4_;
          if (fVar11 <= (float)local_58._0_4_) {
            fVar13 = fVar11;
          }
          if ((fVar13 < (pIVar4->PlotRect).Max.x) &&
             (fVar13 = (float)(-(uint)(fVar11 <= (float)local_58._0_4_) & local_58._0_4_ |
                              ~-(uint)(fVar11 <= (float)local_58._0_4_) & (uint)fVar11),
             (pIVar4->PlotRect).Min.x <= fVar13 && fVar13 != (pIVar4->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_60,col,line_weight);
          }
        }
        iVar10 = iVar10 + 1;
        iVar9 = getter->Count;
        local_58 = (undefined1  [8])local_60;
      } while (iVar10 < iVar9);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}